

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int ON_Material::CompareNameAndIds(ON_Material *a,ON_Material *b)

{
  int iVar1;
  ON_UUID *pOVar2;
  wchar_t *other_string;
  ON_Texture *pOVar3;
  ON_Texture *pOVar4;
  int local_6c;
  int i;
  int tcount;
  undefined1 local_58 [20];
  int local_44;
  undefined1 auStack_40 [4];
  int rc;
  ON_UUID bid;
  ON_UUID aid;
  ON_Material *b_local;
  ON_Material *a_local;
  
  pOVar2 = ON_ModelComponent::Id(&a->super_ON_ModelComponent);
  bid.Data4 = *(uchar (*) [8])pOVar2;
  pOVar2 = ON_ModelComponent::Id(&b->super_ON_ModelComponent);
  auStack_40 = pOVar2->Data1;
  unique0x00012004 = pOVar2->Data2;
  unique0x00012006 = pOVar2->Data3;
  bid._0_8_ = *(undefined8 *)pOVar2->Data4;
  local_44 = ON_UuidCompare((ON_UUID *)bid.Data4,(ON_UUID *)auStack_40);
  a_local._4_4_ = local_44;
  if (local_44 == 0) {
    ON_ModelComponent::Name((ON_ModelComponent *)(local_58 + 8));
    ON_ModelComponent::Name((ON_ModelComponent *)local_58);
    other_string = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_58);
    local_44 = ON_wString::CompareOrdinal((ON_wString *)(local_58 + 8),other_string,false);
    ON_wString::~ON_wString((ON_wString *)local_58);
    ON_wString::~ON_wString((ON_wString *)(local_58 + 8));
    if (local_44 == 0) {
      local_44 = ON_UuidCompare(&a->m_rdk_material_instance_id,&b->m_rdk_material_instance_id);
      a_local._4_4_ = local_44;
      if (local_44 == 0) {
        iVar1 = ON_ClassArray<ON_Texture>::Count(&(a->m_textures).super_ON_ClassArray<ON_Texture>);
        local_44 = ON_ClassArray<ON_Texture>::Count
                             (&(b->m_textures).super_ON_ClassArray<ON_Texture>);
        local_44 = iVar1 - local_44;
        for (local_6c = 0; local_6c < iVar1 && local_44 == 0; local_6c = local_6c + 1) {
          pOVar3 = ON_ClassArray<ON_Texture>::operator[]
                             (&(a->m_textures).super_ON_ClassArray<ON_Texture>,local_6c);
          pOVar4 = ON_ClassArray<ON_Texture>::operator[]
                             (&(b->m_textures).super_ON_ClassArray<ON_Texture>,local_6c);
          local_44 = ON_UuidCompare(&pOVar3->m_texture_id,&pOVar4->m_texture_id);
        }
        a_local._4_4_ = local_44;
      }
    }
    else {
      a_local._4_4_ = local_44;
    }
  }
  return a_local._4_4_;
}

Assistant:

int ON_Material::CompareNameAndIds( const ON_Material& a, const ON_Material& b )
{
  // do NOT test index or id

  const ON_UUID aid = a.Id();
  const ON_UUID bid = b.Id();
  int rc = ON_UuidCompare( &aid, &bid );
  if (rc) return rc;

  rc = a.Name().CompareOrdinal( static_cast< const wchar_t* >(b.Name()), false );
  if (rc) return rc;

  rc = ON_UuidCompare(&a.m_rdk_material_instance_id, &b.m_rdk_material_instance_id);
  if (rc) return rc;

  const int tcount = a.m_textures.Count();
  rc = tcount - b.m_textures.Count();
  for (int i = 0; i < tcount && 0 == rc; i++)
  {
    rc = ON_UuidCompare(a.m_textures[i].m_texture_id, b.m_textures[i].m_texture_id);
  }

  return rc;
}